

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ms_gauden.c
# Opt level: O3

int32 gauden_mllr_transform(gauden_t *g,ps_mllr_t *mllr,ps_config_t *config)

{
  int32 **out_veclen;
  int32 *out_n_feat;
  uint uVar1;
  mfcc_t ****ppppmVar2;
  float32 *pfVar3;
  float32 **ppfVar4;
  mfcc_t *pmVar5;
  mfcc_t *pmVar6;
  logmath_t *lmath;
  char *pcVar7;
  float ****ppppfVar8;
  void *ptr;
  int iVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  double dVar16;
  int32 *flen;
  int local_60;
  uint local_5c;
  int32 *local_58;
  int32 *local_50;
  ps_config_t *local_48;
  int32 *local_40;
  int local_34;
  
  ppppmVar2 = g->mean;
  if (ppppmVar2 != (mfcc_t ****)0x0) {
    ckd_free(***ppppmVar2);
    ckd_free_3d(ppppmVar2);
  }
  ppppmVar2 = g->var;
  if (ppppmVar2 != (mfcc_t ****)0x0) {
    ckd_free(***ppppmVar2);
    ckd_free_3d(ppppmVar2);
  }
  if (g->det != (mfcc_t ***)0x0) {
    ckd_free_3d(g->det);
  }
  out_veclen = &g->featlen;
  if (g->featlen != (int32 *)0x0) {
    ckd_free(g->featlen);
  }
  g->det = (mfcc_t ***)0x0;
  g->featlen = (int32 *)0x0;
  pcVar7 = ps_config_str(config,"mean");
  local_58 = &g->n_mgau;
  out_n_feat = &g->n_feat;
  local_50 = &g->n_density;
  ppppfVar8 = gauden_param_read(pcVar7,local_58,out_n_feat,local_50,out_veclen);
  g->mean = (mfcc_t ****)ppppfVar8;
  local_48 = config;
  pcVar7 = ps_config_str(config,"var");
  ppppfVar8 = gauden_param_read(pcVar7,&local_34,(int32 *)&local_5c,&local_60,&local_40);
  g->var = (mfcc_t ****)ppppfVar8;
  if (local_34 == g->n_mgau) {
    if ((local_5c == *out_n_feat) && (local_60 == *local_50)) {
      if (0 < (int)local_5c) {
        uVar10 = 0;
        do {
          if ((*out_veclen)[uVar10] != local_40[uVar10]) {
            pcVar7 = "Feature lengths for means and variances differ\n";
            lVar14 = 0x21b;
            goto LAB_0015040a;
          }
          uVar10 = uVar10 + 1;
        } while (local_5c != uVar10);
      }
      ckd_free(local_40);
      iVar9 = *local_58;
      if (0 < iVar9) {
        uVar10 = (ulong)(uint)*out_n_feat;
        lVar14 = 0;
        do {
          if (0 < (int)uVar10) {
            lVar11 = 0;
            do {
              ptr = __ckd_calloc__((long)(*out_veclen)[lVar11],8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
                                   ,0x222);
              iVar9 = *local_50;
              if (0 < (long)iVar9) {
                uVar1 = (*out_veclen)[lVar11];
                uVar10 = (ulong)uVar1;
                lVar12 = 0;
                do {
                  if (0 < (int)uVar1) {
                    pfVar3 = *mllr->b[lVar11];
                    ppfVar4 = *mllr->A[lVar11];
                    pmVar5 = g->mean[lVar14][lVar11][lVar12];
                    uVar13 = 0;
                    do {
                      dVar16 = 0.0;
                      uVar15 = 0;
                      do {
                        dVar16 = dVar16 + (double)((float)ppfVar4[uVar13][uVar15] *
                                                  (float)pmVar5[uVar15]);
                        uVar15 = uVar15 + 1;
                      } while (uVar10 != uVar15);
                      *(double *)((long)ptr + uVar13 * 8) = dVar16 + (double)(float)pfVar3[uVar13];
                      uVar13 = uVar13 + 1;
                    } while (uVar13 != uVar10);
                    if (0 < (int)uVar1) {
                      pmVar5 = g->mean[lVar14][lVar11][lVar12];
                      pfVar3 = *mllr->h[lVar11];
                      pmVar6 = g->var[lVar14][lVar11][lVar12];
                      uVar13 = 0;
                      do {
                        pmVar5[uVar13] = (mfcc_t)(float)*(double *)((long)ptr + uVar13 * 8);
                        pmVar6[uVar13] = (mfcc_t)((float)pfVar3[uVar13] * (float)pmVar6[uVar13]);
                        uVar13 = uVar13 + 1;
                      } while (uVar10 != uVar13);
                    }
                  }
                  lVar12 = lVar12 + 1;
                } while (lVar12 != iVar9);
              }
              ckd_free(ptr);
              lVar11 = lVar11 + 1;
              uVar10 = (ulong)*out_n_feat;
            } while (lVar11 < (long)uVar10);
            iVar9 = *local_58;
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < iVar9);
      }
      lmath = g->lmath;
      dVar16 = ps_config_float(local_48,"varfloor");
      gauden_dist_precompute(g,lmath,(float32)(float)dVar16);
      return 0;
    }
  }
  pcVar7 = "Mixture-gaussians dimensions for means and variances differ\n";
  lVar14 = 0x218;
LAB_0015040a:
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
          ,lVar14,pcVar7);
  exit(1);
}

Assistant:

int32
gauden_mllr_transform(gauden_t *g, ps_mllr_t *mllr, ps_config_t *config)
{
    int32 i, m, f, d, *flen;

    /* Free data if already here */
    if (g->mean)
        gauden_param_free(g->mean);
    if (g->var)
        gauden_param_free(g->var);
    if (g->det)
        ckd_free_3d(g->det);
    if (g->featlen)
        ckd_free(g->featlen);
    g->det = NULL;
    g->featlen = NULL;

    /* Reload means and variances (un-precomputed). */
    g->mean = (mfcc_t ****)gauden_param_read(ps_config_str(config, "mean"), &g->n_mgau, &g->n_feat, &g->n_density,
                      &g->featlen);
    g->var = (mfcc_t ****)gauden_param_read(ps_config_str(config, "var"), &m, &f, &d, &flen);

    /* Verify mean and variance parameter dimensions */
    if ((m != g->n_mgau) || (f != g->n_feat) || (d != g->n_density))
        E_FATAL
            ("Mixture-gaussians dimensions for means and variances differ\n");
    for (i = 0; i < g->n_feat; i++)
        if (g->featlen[i] != flen[i])
            E_FATAL("Feature lengths for means and variances differ\n");
    ckd_free(flen);

    /* Transform codebook for each stream s */
    for (i = 0; i < g->n_mgau; ++i) {
        for (f = 0; f < g->n_feat; ++f) {
            float64 *temp;
            temp = (float64 *) ckd_calloc(g->featlen[f], sizeof(float64));
            /* Transform each density d in selected codebook */
            for (d = 0; d < g->n_density; d++) {
                int l;
                for (l = 0; l < g->featlen[f]; l++) {
                    temp[l] = 0.0;
                    for (m = 0; m < g->featlen[f]; m++) {
                        /* FIXME: For now, only one class, hence the zeros below. */
                        temp[l] += mllr->A[f][0][l][m] * g->mean[i][f][d][m];
                    }
                    temp[l] += mllr->b[f][0][l];
                }

                for (l = 0; l < g->featlen[f]; l++) {
                    g->mean[i][f][d][l] = (float32) temp[l];
                    g->var[i][f][d][l] *= mllr->h[f][0][l];
                }
            }
            ckd_free(temp);
        }
    }

    /* Re-precompute (if we aren't adapting variances this isn't
     * actually necessary...) */
    gauden_dist_precompute(g, g->lmath, ps_config_float(config, "varfloor"));
    return 0;
}